

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofXyz.cpp
# Opt level: O0

void __thiscall OpenMD::GofXyz::initializeHistogram(GofXyz *this)

{
  bool bVar1;
  SnapshotManager *this_00;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>,_bool> pVar2;
  RotMat3x3d rotMat;
  Vector3d yaxis;
  Vector3d xaxis;
  Vector3d zaxis;
  MultipoleAdapter ma1;
  AtomType *atype1;
  Vector3d v1;
  Vector3d r1;
  Vector3d r3;
  StuntDouble *sd3;
  StuntDouble *sd1;
  int j;
  int i;
  bool usePeriodicBoundaryConditions_;
  undefined7 in_stack_fffffffffffffd28;
  undefined1 in_stack_fffffffffffffd2f;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_> in_stack_fffffffffffffd30
  ;
  StuntDouble *in_stack_fffffffffffffd38;
  uint row;
  undefined4 in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd44;
  Vector<double,_3U> *in_stack_fffffffffffffd50;
  RectMatrix<double,_3U,_3U> *in_stack_fffffffffffffd58;
  SelectionEvaluator *in_stack_fffffffffffffd68;
  SquareMatrix3<double> *this_01;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_> in_stack_fffffffffffffd90
  ;
  undefined1 in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffd99;
  Vector3d *in_stack_fffffffffffffda8;
  Snapshot *in_stack_fffffffffffffdb0;
  RectMatrix<double,_3U,_3U> local_208;
  SquareMatrix3<double> local_190 [2];
  Vector<double,_3U> local_d0;
  MultipoleAdapter local_b8;
  AtomType *local_b0;
  StuntDouble *local_48;
  Atom *local_40;
  byte local_2d;
  
  bVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0xfd0));
  if (!bVar1) {
    SelectionEvaluator::evaluate(in_stack_fffffffffffffd68);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
               (SelectionSet *)in_stack_fffffffffffffd38);
    SelectionSet::~SelectionSet((SelectionSet *)0x1581e6);
  }
  SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
  local_2d = Globals::getUsePeriodicBoundaryConditions((Globals *)0x158224);
  std::
  map<int,_OpenMD::SquareMatrix3<double>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
  ::clear((map<int,_OpenMD::SquareMatrix3<double>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
           *)0x15823e);
  local_40 = (Atom *)SelectionManager::beginSelected
                               ((SelectionManager *)
                                CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                (int *)in_stack_fffffffffffffd38);
  local_48 = SelectionManager::beginSelected
                       ((SelectionManager *)
                        CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                        (int *)in_stack_fffffffffffffd38);
  while (local_40 != (Atom *)0x0 || local_48 != (StuntDouble *)0x0) {
    StuntDouble::getPos(in_stack_fffffffffffffd38);
    StuntDouble::getPos(in_stack_fffffffffffffd38);
    OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffd38,
                      (Vector<double,_3U> *)in_stack_fffffffffffffd30._M_node);
    Vector3<double>::Vector3
              ((Vector3<double> *)in_stack_fffffffffffffd30._M_node,
               (Vector<double,_3U> *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    if ((local_2d & 1) != 0) {
      this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
      SnapshotManager::getCurrentSnapshot(this_00);
      Snapshot::wrapVector(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    }
    local_b0 = Atom::getAtomType(local_40);
    MultipoleAdapter::MultipoleAdapter(&local_b8,local_b0);
    Vector3<double>::Vector3((Vector3<double> *)0x158371);
    bVar1 = MultipoleAdapter::isDipole
                      ((MultipoleAdapter *)
                       CONCAT71(in_stack_fffffffffffffd99,in_stack_fffffffffffffd98));
    if (bVar1) {
      StuntDouble::getDipole(in_stack_fffffffffffffd38);
      row = (uint)((ulong)in_stack_fffffffffffffd38 >> 0x20);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffd30._M_node,
                 (Vector3<double> *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28));
    }
    else {
      this_01 = local_190;
      StuntDouble::getA(in_stack_fffffffffffffd38);
      SquareMatrix3<double>::transpose(this_01);
      OpenMD::operator*(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
      Vector3<double>::operator=
                ((Vector3<double> *)in_stack_fffffffffffffd38,
                 (Vector<double,_3U> *)in_stack_fffffffffffffd30._M_node);
      row = (uint)((ulong)in_stack_fffffffffffffd38 >> 0x20);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x158423);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x158430);
    }
    in_stack_fffffffffffffd50 = &local_d0;
    cross<double>((Vector3<double> *)CONCAT71(in_stack_fffffffffffffd99,in_stack_fffffffffffffd98),
                  (Vector3<double> *)in_stack_fffffffffffffd90._M_node);
    cross<double>((Vector3<double> *)CONCAT71(in_stack_fffffffffffffd99,in_stack_fffffffffffffd98),
                  (Vector3<double> *)in_stack_fffffffffffffd90._M_node);
    Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffd30._M_node);
    Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffd30._M_node);
    Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_fffffffffffffd30._M_node);
    in_stack_fffffffffffffd58 = &local_208;
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x1584ee);
    RectMatrix<double,_3U,_3U>::setRow
              ((RectMatrix<double,_3U,_3U> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),row,
               (Vector<double,_3U> *)in_stack_fffffffffffffd30._M_node);
    RectMatrix<double,_3U,_3U>::setRow
              ((RectMatrix<double,_3U,_3U> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),row,
               (Vector<double,_3U> *)in_stack_fffffffffffffd30._M_node);
    RectMatrix<double,_3U,_3U>::setRow
              ((RectMatrix<double,_3U,_3U> *)
               CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),row,
               (Vector<double,_3U> *)in_stack_fffffffffffffd30._M_node);
    in_stack_fffffffffffffd38 = (StuntDouble *)(in_RDI + 0x1600);
    in_stack_fffffffffffffd44 = StuntDouble::getGlobalIndex(&local_40->super_StuntDouble);
    std::pair<const_int,_OpenMD::SquareMatrix3<double>_>::
    pair<int,_OpenMD::SquareMatrix3<double>_&,_true>
              ((pair<const_int,_OpenMD::SquareMatrix3<double>_> *)in_stack_fffffffffffffd30._M_node,
               (int *)CONCAT17(in_stack_fffffffffffffd2f,in_stack_fffffffffffffd28),
               (SquareMatrix3<double> *)0x15857e);
    pVar2 = std::
            map<int,_OpenMD::SquareMatrix3<double>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
            ::insert((map<int,_OpenMD::SquareMatrix3<double>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::SquareMatrix3<double>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                     (value_type *)in_stack_fffffffffffffd38);
    in_stack_fffffffffffffd30 = pVar2.first._M_node;
    in_stack_fffffffffffffd2f = pVar2.second;
    in_stack_fffffffffffffd90._M_node = in_stack_fffffffffffffd30._M_node;
    in_stack_fffffffffffffd98 = in_stack_fffffffffffffd2f;
    std::pair<const_int,_OpenMD::SquareMatrix3<double>_>::~pair
              ((pair<const_int,_OpenMD::SquareMatrix3<double>_> *)0x1585bc);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x1585c9);
    local_40 = (Atom *)SelectionManager::nextSelected
                                 ((SelectionManager *)
                                  CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                  (int *)in_stack_fffffffffffffd38);
    local_48 = SelectionManager::nextSelected
                         ((SelectionManager *)
                          CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                          (int *)in_stack_fffffffffffffd38);
  }
  return;
}

Assistant:

void GofXyz::initializeHistogram() {
    // Calculate the center of mass of the molecule of selected
    // StuntDouble in selection1

    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    assert(seleMan1_.getSelectionCount() == seleMan3_.getSelectionCount());
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    // The Dipole direction of selection3 and position of selection3 will
    // be used to determine the y-z plane
    // v1 = s3 -s1,
    // z = origin.dipole
    // x = v1 X z
    // y = z X x
    rotMats_.clear();

    int i;
    int j;
    StuntDouble* sd1;
    StuntDouble* sd3;

    for (sd1 = seleMan1_.beginSelected(i), sd3 = seleMan3_.beginSelected(j);
         sd1 != NULL || sd3 != NULL;
         sd1 = seleMan1_.nextSelected(i), sd3 = seleMan3_.nextSelected(j)) {
      Vector3d r3 = sd3->getPos();
      Vector3d r1 = sd1->getPos();
      Vector3d v1 = r3 - r1;
      if (usePeriodicBoundaryConditions_)
        info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(v1);

      AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
      MultipoleAdapter ma1 = MultipoleAdapter(atype1);

      Vector3d zaxis;
      if (ma1.isDipole())
        zaxis = sd1->getDipole();
      else
        zaxis = sd1->getA().transpose() * V3Z;

      Vector3d xaxis = cross(v1, zaxis);
      Vector3d yaxis = cross(zaxis, xaxis);

      xaxis.normalize();
      yaxis.normalize();
      zaxis.normalize();

      RotMat3x3d rotMat;
      rotMat.setRow(0, xaxis);
      rotMat.setRow(1, yaxis);
      rotMat.setRow(2, zaxis);

      rotMats_.insert(
          std::map<int, RotMat3x3d>::value_type(sd1->getGlobalIndex(), rotMat));
    }
  }